

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  bool bVar7;
  const_reference pvVar8;
  idx_t iVar9;
  uint uVar10;
  idx_t match_count;
  idx_t iVar11;
  idx_t i;
  idx_t iVar12;
  idx_t iVar13;
  idx_t i_1;
  ValidityBytes rhs_mask;
  interval_t local_48;
  TemplatedValidityMask<unsigned_long> *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar8 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  uVar10 = 1 << ((byte)col_idx & 7);
  vVar5 = *pvVar8;
  if (puVar1 == (unsigned_long *)0x0) {
    iVar11 = 0;
    for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
      iVar13 = iVar12;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar13 = (idx_t)sel->sel_vector[iVar12];
      }
      psVar6 = pSVar2->sel_vector;
      iVar9 = iVar13;
      if (psVar6 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar6[iVar13];
      }
      rhs_mask.validity_mask = *(uchar **)(pdVar4 + iVar13 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48._0_8_ = *(undefined8 *)(rhs_mask.validity_mask + vVar5);
      local_48.micros = *(int64_t *)(rhs_mask.validity_mask + vVar5 + 8);
      bVar7 = NotDistinctFrom::Operation<duckdb::interval_t>
                        ((interval_t *)(pdVar3 + iVar9 * 0x10),&local_48,false,
                         (uVar10 & rhs_mask.validity_mask[col_idx >> 3]) == 0);
      if (bVar7) {
        sel->sel_vector[iVar11] = (sel_t)iVar13;
        iVar11 = iVar11 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  else {
    local_38 = &(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>;
    iVar11 = 0;
    for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
      iVar13 = iVar12;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar13 = (idx_t)sel->sel_vector[iVar12];
      }
      psVar6 = pSVar2->sel_vector;
      iVar9 = iVar13;
      if (psVar6 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar6[iVar13];
      }
      bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_38,iVar9);
      rhs_mask.validity_mask = *(uchar **)(pdVar4 + iVar13 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48._0_8_ = *(undefined8 *)(rhs_mask.validity_mask + vVar5);
      local_48.micros = *(int64_t *)(rhs_mask.validity_mask + vVar5 + 8);
      bVar7 = NotDistinctFrom::Operation<duckdb::interval_t>
                        ((interval_t *)(pdVar3 + iVar9 * 0x10),&local_48,!bVar7,
                         (uVar10 & rhs_mask.validity_mask[col_idx >> 3]) == 0);
      if (bVar7) {
        sel->sel_vector[iVar11] = (sel_t)iVar13;
        iVar11 = iVar11 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  return iVar11;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}